

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O0

void __thiscall rtc::Buffer::EnsureCapacity(Buffer *this,size_t capacity)

{
  bool bVar1;
  ostream *poVar2;
  uchar *__p;
  pointer __dest;
  pointer __src;
  FatalMessage local_338;
  FatalMessageVoidify local_1b9;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_1b8;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> new_data;
  FatalMessage local_198;
  FatalMessageVoidify local_19;
  ulong local_18;
  size_t capacity_local;
  Buffer *this_local;
  
  local_18 = capacity;
  capacity_local = (size_t)this;
  bVar1 = IsConsistent(this);
  if (!bVar1) {
    FatalMessageVoidify::FatalMessageVoidify(&local_19);
    FatalMessage::FatalMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/buffer.h"
               ,0xd6);
    poVar2 = FatalMessage::stream(&local_198);
    poVar2 = std::operator<<(poVar2,"Check failed: IsConsistent()");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"# ");
    FatalMessageVoidify::operator&(&local_19,poVar2);
    FatalMessage::~FatalMessage(&local_198);
  }
  if (this->capacity_ < local_18) {
    __p = (uchar *)operator_new__(local_18);
    std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
    unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
              ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&local_1b8,__p);
    __dest = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (&local_1b8);
    __src = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                      (&this->data_);
    memcpy(__dest,__src,this->size_);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
              (&this->data_,&local_1b8);
    this->capacity_ = local_18;
    bVar1 = IsConsistent(this);
    if (!bVar1) {
      FatalMessageVoidify::FatalMessageVoidify(&local_1b9);
      FatalMessage::FatalMessage
                (&local_338,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/buffer.h"
                 ,0xdd);
      poVar2 = FatalMessage::stream(&local_338);
      poVar2 = std::operator<<(poVar2,"Check failed: IsConsistent()");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,"# ");
      FatalMessageVoidify::operator&(&local_1b9,poVar2);
      FatalMessage::~FatalMessage(&local_338);
    }
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&local_1b8)
    ;
  }
  return;
}

Assistant:

void EnsureCapacity(size_t capacity) {
    RTC_DCHECK(IsConsistent());
    if (capacity <= capacity_)
      return;
    std::unique_ptr<uint8_t[]> new_data(new uint8_t[capacity]);
    std::memcpy(new_data.get(), data_.get(), size_);
    data_ = std::move(new_data);
    capacity_ = capacity;
    RTC_DCHECK(IsConsistent());
  }